

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O0

void __thiscall
QTextOdfWriter::writeInlineCharacter
          (QTextOdfWriter *this,QXmlStreamWriter *writer,QTextFragment *fragment)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  QByteArray *pQVar5;
  QUrl *__n;
  void *__buf;
  void *__buf_00;
  QAnyStringView *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  int imgQuality;
  char16_t *str_1;
  char16_t *str;
  char16_t *str_2;
  char16_t *str_3;
  QString filename;
  QImageWriter imageWriter_1;
  QImageWriter imageWriter;
  QBuffer imageBytes;
  QFile file;
  QBuffer buffer;
  QUrl url;
  QString name;
  QImage image;
  qreal height;
  qreal width;
  QString mimeType;
  QByteArray data;
  QTextImageFormat imageFormat;
  QVariant variant;
  QTextFormat *in_stack_fffffffffffffa18;
  DataPointer *dd;
  QTextFormat *in_stack_fffffffffffffa20;
  QArrayDataPointer<char16_t> *this_00;
  QImage *in_stack_fffffffffffffa28;
  QAnyStringView *pQVar13;
  QTextFormat *in_stack_fffffffffffffa30;
  QAnyStringView *this_01;
  QTextFragment *in_stack_fffffffffffffa38;
  QAnyStringView *pQVar14;
  QOutputStrategy *in_stack_fffffffffffffa40;
  QImage *in_stack_fffffffffffffa48;
  undefined7 in_stack_fffffffffffffa58;
  QArrayDataPointer<char16_t> *local_4e8;
  storage_type *local_4e0;
  undefined1 local_4d0 [40];
  QAnyStringView *local_4a8;
  QAnyStringView *local_4a0;
  storage_type *local_498;
  undefined1 local_488 [40];
  QAnyStringView *local_460;
  QArrayDataPointer<char16_t> local_450 [2];
  QArrayDataPointer<char16_t> *local_418;
  QArrayDataPointer<char16_t> local_410 [2];
  QAnyStringView *local_3d0;
  QAnyStringView *local_3c8;
  DataPointer *local_3a8;
  QString *local_3a0;
  storage_type *local_398;
  undefined1 local_388 [40];
  QAnyStringView *local_360;
  QAnyStringView *local_358;
  storage_type *local_328;
  undefined1 local_318 [40];
  QAnyStringView *local_2f0;
  QAnyStringView *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  QArrayDataPointer<char16_t> local_2c8 [2];
  QByteArray local_298;
  QImageWriter local_280;
  QArrayDataPointer<char16_t> local_278 [2];
  QByteArray local_248;
  QImageWriter local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  undefined1 local_1f8 [24];
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  QUrl local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  undefined1 local_168 [16];
  QImageData *local_158;
  double local_150;
  QUrl local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  QByteArray local_128 [2];
  DataPointer *local_f8;
  QArrayDataPointer<char16_t> *local_f0;
  storage_type *local_e8;
  undefined1 local_d8 [40];
  QAnyStringView *local_b0;
  QAnyStringView *local_a8;
  storage_type *local_a0;
  undefined1 local_90 [40];
  QAnyStringView *local_68;
  undefined1 *local_48;
  undefined1 *local_40;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffffa30,(QString *)in_stack_fffffffffffffa28);
  QByteArrayView::QByteArrayView<6ul>
            ((QByteArrayView *)in_stack_fffffffffffffa30,(char (*) [6])in_stack_fffffffffffffa28);
  QVar7.m_data = local_a0;
  QVar7.m_size = (qsizetype)local_90;
  QString::fromLatin1(QVar7);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffffa30,(QString *)in_stack_fffffffffffffa28);
  QXmlStreamWriter::writeStartElement((QAnyStringView *)in_RSI,local_68);
  QString::~QString((QString *)0x9eb42c);
  if (*(long *)(in_RDI + 0xd8) != 0) {
    QTextFragment::charFormat(in_stack_fffffffffffffa38);
    bVar1 = QTextFormat::isImageFormat(in_stack_fffffffffffffa20);
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x9eb473);
    if ((bVar1 & 1) != 0) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      QTextFragment::charFormat(in_stack_fffffffffffffa38);
      QTextFormat::toImageFormat(in_stack_fffffffffffffa18);
      QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x9eb4d5);
      pQVar13 = in_RSI;
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffffa30,(QString *)in_stack_fffffffffffffa28);
      QByteArrayView::QByteArrayView<5ul>
                ((QByteArrayView *)in_stack_fffffffffffffa30,(char (*) [5])in_stack_fffffffffffffa28
                );
      QVar8.m_data = local_e8;
      QVar8.m_size = (qsizetype)local_d8;
      QString::fromLatin1(QVar8);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffffa30,(QString *)in_stack_fffffffffffffa28);
      QTextImageFormat::name((QTextImageFormat *)in_stack_fffffffffffffa18);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffffa30,(QString *)in_stack_fffffffffffffa28);
      QXmlStreamWriter::writeAttribute((QAnyStringView *)pQVar13,local_b0,local_a8);
      QString::~QString((QString *)0x9eb5b7);
      QString::~QString((QString *)0x9eb5c4);
      local_128[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_128[0].d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      local_128[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QByteArray::QByteArray((QByteArray *)0x9eb5fe);
      local_140 = &DAT_aaaaaaaaaaaaaaaa;
      local_138 = &DAT_aaaaaaaaaaaaaaaa;
      local_130 = &DAT_aaaaaaaaaaaaaaaa;
      QString::QString((QString *)0x9eb638);
      local_148.d = (QUrlPrivate *)0x0;
      local_150 = 0.0;
      local_168._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_168._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_158 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
      QImage::QImage((QImage *)local_f0);
      local_180 = &DAT_aaaaaaaaaaaaaaaa;
      local_178 = &DAT_aaaaaaaaaaaaaaaa;
      local_170 = &DAT_aaaaaaaaaaaaaaaa;
      QTextImageFormat::name((QTextImageFormat *)local_f8);
      QVar6 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffffa28,(size_t)local_f0);
      uVar4 = QString::startsWith((QLatin1String *)&local_180,(CaseSensitivity)QVar6.m_size);
      dd = local_f8;
      this_00 = local_f0;
      if ((uVar4 & 1) != 0) {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffffa28,(size_t)local_f0);
        QVar6.m_data = (char *)in_stack_fffffffffffffa38;
        QVar6.m_size = (qsizetype)in_stack_fffffffffffffa30;
        QString::prepend((QString *)local_f8,QVar6);
        dd = local_f8;
        this_00 = local_f0;
      }
      local_188.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QUrl::QUrl(&local_188,(QString *)&local_180,TolerantMode);
      local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      __n = &local_188;
      QTextDocument::resource
                ((QTextDocument *)CONCAT17(bVar1,in_stack_fffffffffffffa58),
                 (int)((ulong)pQVar13 >> 0x20),(QUrl *)in_stack_fffffffffffffa48);
      iVar3 = ::QVariant::userType((QVariant *)0x9eb7d0);
      if ((iVar3 == 0x1001) || (iVar3 = ::QVariant::userType((QVariant *)0x9eb7e4), iVar3 == 0x1006)
         ) {
        qvariant_cast<QImage>((QVariant *)in_stack_fffffffffffffa38);
        QImage::operator=(in_stack_fffffffffffffa28,(QImage *)this_00);
        QImage::~QImage((QImage *)this_00);
      }
      else {
        iVar3 = ::QVariant::userType((QVariant *)0x9eb834);
        if (iVar3 == 0xc) {
          ::QVariant::toByteArray();
          QByteArray::operator=((QByteArray *)this_00,(QByteArray *)dd);
          QByteArray::~QByteArray((QByteArray *)0x9eb874);
          local_1c8 = &DAT_aaaaaaaaaaaaaaaa;
          local_1c0 = &DAT_aaaaaaaaaaaaaaaa;
          QBuffer::QBuffer((QBuffer *)&local_1c8,(QByteArray *)local_128,(QObject *)0x0);
          QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                    ((QFlags<QIODeviceBase::OpenModeFlag> *)this_00,
                     (OpenModeFlag)((ulong)dd >> 0x20));
          QBuffer::open((QFlags_conflict *)&local_1c8);
          __n = &local_148;
          probeImageData((QIODevice *)pQVar13,in_stack_fffffffffffffa48,
                         (QString *)in_stack_fffffffffffffa40,(qreal *)in_stack_fffffffffffffa38,
                         (qreal *)in_stack_fffffffffffffa30);
          QBuffer::~QBuffer((QBuffer *)&local_1c8);
        }
        else {
          local_1e0 = &DAT_aaaaaaaaaaaaaaaa;
          local_1d8 = &DAT_aaaaaaaaaaaaaaaa;
          QTextImageFormat::name((QTextImageFormat *)dd);
          QFile::QFile((QFile *)&local_1e0,(QString *)local_1f8);
          QString::~QString((QString *)0x9eb965);
          QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                    ((QFlags<QIODeviceBase::OpenModeFlag> *)this_00,
                     (OpenModeFlag)((ulong)dd >> 0x20));
          uVar4 = QFile::open((QFlags_conflict *)&local_1e0);
          if ((uVar4 & 1) != 0) {
            __n = &local_148;
            bVar2 = probeImageData((QIODevice *)pQVar13,in_stack_fffffffffffffa48,
                                   (QString *)in_stack_fffffffffffffa40,
                                   (qreal *)in_stack_fffffffffffffa38,
                                   (qreal *)in_stack_fffffffffffffa30);
            if (!bVar2) {
              QFileDevice::seek((longlong)&local_1e0);
              QIODevice::readAll();
              QByteArray::operator=((QByteArray *)this_00,(QByteArray *)dd);
              QByteArray::~QByteArray((QByteArray *)0x9eba0a);
            }
          }
          QFile::~QFile((QFile *)&local_1e0);
        }
      }
      bVar2 = QImage::isNull((QImage *)local_168);
      if (!bVar2) {
        local_228 = &DAT_aaaaaaaaaaaaaaaa;
        local_220 = &DAT_aaaaaaaaaaaaaaaa;
        QBuffer::QBuffer((QBuffer *)&local_228,(QObject *)0x0);
        iVar3 = QTextImageFormat::quality((QTextImageFormat *)0x9eba6a);
        if (((99 < iVar3) || (iVar3 < 1)) ||
           (bVar2 = QImage::hasAlphaChannel(in_stack_fffffffffffffa28), bVar2)) {
          local_230.d = (QImageWriterPrivate *)&DAT_aaaaaaaaaaaaaaaa;
          QByteArray::QByteArray(&local_248,"png",-1);
          QImageWriter::QImageWriter
                    ((QImageWriter *)in_stack_fffffffffffffa30,
                     (QIODevice *)in_stack_fffffffffffffa28,(QByteArray *)this_00);
          QByteArray::~QByteArray((QByteArray *)0x9ebae6);
          QImageWriter::write(&local_230,(int)local_168,__buf,(size_t)__n);
          pQVar5 = (QByteArray *)QBuffer::data();
          QByteArray::operator=(local_128,pQVar5);
          QArrayDataPointer<char16_t>::QArrayDataPointer(local_278,(Data *)0x0,L"image/png",9);
          QString::QString((QString *)this_00,dd);
          QString::operator=((QString *)this_00,(QString *)dd);
          QString::~QString((QString *)0x9ebb9c);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
          QImageWriter::~QImageWriter((QImageWriter *)in_stack_fffffffffffffa30);
        }
        else {
          local_280.d = (QImageWriterPrivate *)&DAT_aaaaaaaaaaaaaaaa;
          QByteArray::QByteArray(&local_298,"jpg",-1);
          QImageWriter::QImageWriter
                    ((QImageWriter *)in_stack_fffffffffffffa30,
                     (QIODevice *)in_stack_fffffffffffffa28,(QByteArray *)this_00);
          QByteArray::~QByteArray((QByteArray *)0x9ebc0f);
          QImageWriter::setQuality(&local_280,iVar3);
          QImageWriter::write(&local_280,(int)local_168,__buf_00,(size_t)__n);
          pQVar5 = (QByteArray *)QBuffer::data();
          QByteArray::operator=(local_128,pQVar5);
          QArrayDataPointer<char16_t>::QArrayDataPointer(local_2c8,(Data *)0x0,L"image/jpg",9);
          QString::QString((QString *)this_00,dd);
          QString::operator=((QString *)this_00,(QString *)dd);
          QString::~QString((QString *)0x9ebcd6);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
          QImageWriter::~QImageWriter((QImageWriter *)in_stack_fffffffffffffa30);
        }
        iVar3 = QImage::width((QImage *)local_168);
        local_148.d = (QUrlPrivate *)(double)iVar3;
        iVar3 = QImage::height((QImage *)local_168);
        local_150 = (double)iVar3;
        QBuffer::~QBuffer((QBuffer *)&local_228);
      }
      iVar3 = (int)((ulong)in_stack_fffffffffffffa28 >> 0x20);
      bVar2 = QByteArray::isEmpty((QByteArray *)0x9ebd3e);
      if (!bVar2) {
        bVar2 = QTextFormat::hasProperty(in_stack_fffffffffffffa30,iVar3);
        if (bVar2) {
          local_148.d = (QUrlPrivate *)QTextImageFormat::width((QTextImageFormat *)0x9ebd6b);
        }
        bVar2 = QTextFormat::hasProperty(in_stack_fffffffffffffa30,iVar3);
        if (bVar2) {
          local_150 = QTextImageFormat::height((QTextImageFormat *)0x9ebd99);
        }
        local_2e0 = &DAT_aaaaaaaaaaaaaaaa;
        local_2d8 = &DAT_aaaaaaaaaaaaaaaa;
        local_2d0 = &DAT_aaaaaaaaaaaaaaaa;
        QOutputStrategy::createUniqueImageName(in_stack_fffffffffffffa40);
        (**(code **)(**(long **)(in_RDI + 0xd8) + 0x10))
                  (*(long **)(in_RDI + 0xd8),&local_2e0,&local_140,local_128);
        pQVar13 = in_RSI;
        QAnyStringView::QAnyStringView
                  ((QAnyStringView *)in_stack_fffffffffffffa30,(QString *)in_RSI);
        QByteArrayView::QByteArrayView<6ul>
                  ((QByteArrayView *)in_stack_fffffffffffffa30,(char (*) [6])pQVar13);
        QVar9.m_data = local_328;
        QVar9.m_size = (qsizetype)local_318;
        QString::fromLatin1(QVar9);
        QAnyStringView::QAnyStringView
                  ((QAnyStringView *)in_stack_fffffffffffffa30,(QString *)pQVar13);
        pixelToPoint((qreal)in_stack_fffffffffffffa30);
        QAnyStringView::QAnyStringView
                  ((QAnyStringView *)in_stack_fffffffffffffa30,(QString *)pQVar13);
        QXmlStreamWriter::writeAttribute((QAnyStringView *)pQVar13,local_2f0,local_2e8);
        QString::~QString((QString *)0x9ebef8);
        QString::~QString((QString *)0x9ebf05);
        this_01 = in_RSI;
        QAnyStringView::QAnyStringView(in_RSI,(QString *)pQVar13);
        QByteArrayView::QByteArrayView<7ul>((QByteArrayView *)this_01,(char (*) [7])pQVar13);
        QVar10.m_data = local_398;
        QVar10.m_size = (qsizetype)local_388;
        QString::fromLatin1(QVar10);
        QAnyStringView::QAnyStringView(this_01,(QString *)pQVar13);
        pixelToPoint((qreal)this_01);
        QAnyStringView::QAnyStringView(this_01,(QString *)pQVar13);
        QXmlStreamWriter::writeAttribute((QAnyStringView *)this_01,local_360,local_358);
        QString::~QString((QString *)0x9ebfeb);
        QString::~QString((QString *)0x9ebff8);
        pQVar14 = in_RSI;
        QAnyStringView::QAnyStringView(this_01,(QString *)pQVar13);
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_410,(Data *)0x0,L"anchor-type",0xb);
        QString::QString(local_3a0,local_3a8);
        QAnyStringView::QAnyStringView(this_01,(QString *)pQVar13);
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_450,(Data *)0x0,L"as-char",7);
        QString::QString(local_3a0,local_3a8);
        QAnyStringView::QAnyStringView(this_01,(QString *)pQVar13);
        QXmlStreamWriter::writeAttribute((QAnyStringView *)pQVar14,local_3d0,local_3c8);
        QString::~QString((QString *)0x9ec158);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(local_418);
        QString::~QString((QString *)0x9ec172);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(local_418);
        pQVar14 = in_RSI;
        QAnyStringView::QAnyStringView(this_01,(QString *)pQVar13);
        QByteArrayView::QByteArrayView<6ul>((QByteArrayView *)this_01,(char (*) [6])pQVar13);
        QVar11.m_data = local_498;
        QVar11.m_size = (qsizetype)local_488;
        QString::fromLatin1(QVar11);
        QAnyStringView::QAnyStringView(this_01,(QString *)pQVar13);
        QXmlStreamWriter::writeStartElement((QAnyStringView *)pQVar14,local_460);
        QString::~QString((QString *)0x9ec21f);
        QAnyStringView::QAnyStringView(this_01,(QString *)pQVar13);
        QByteArrayView::QByteArrayView<5ul>((QByteArrayView *)this_01,(char (*) [5])pQVar13);
        QVar12.m_data = local_4e0;
        QVar12.m_size = (qsizetype)local_4d0;
        QString::fromLatin1(QVar12);
        QAnyStringView::QAnyStringView(this_01,(QString *)pQVar13);
        QAnyStringView::QAnyStringView(this_01,(QString *)pQVar13);
        QXmlStreamWriter::writeAttribute((QAnyStringView *)in_RSI,local_4a8,local_4a0);
        QString::~QString((QString *)0x9ec2ef);
        QXmlStreamWriter::writeEndElement();
        QString::~QString((QString *)0x9ec309);
        this_00 = local_4e8;
      }
      ::QVariant::~QVariant((QVariant *)&local_28);
      QUrl::~QUrl(&local_188);
      QString::~QString((QString *)0x9ec330);
      QImage::~QImage((QImage *)this_00);
      QString::~QString((QString *)0x9ec34a);
      QByteArray::~QByteArray((QByteArray *)0x9ec357);
      QTextImageFormat::~QTextImageFormat((QTextImageFormat *)0x9ec364);
    }
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextOdfWriter::writeInlineCharacter(QXmlStreamWriter &writer, const QTextFragment &fragment) const
{
    writer.writeStartElement(drawNS, QString::fromLatin1("frame"));
    if (m_strategy == nullptr) {
        // don't do anything.
    }
    else if (fragment.charFormat().isImageFormat()) {
        QTextImageFormat imageFormat = fragment.charFormat().toImageFormat();
        writer.writeAttribute(drawNS, QString::fromLatin1("name"), imageFormat.name());

        QByteArray data;
        QString mimeType;
        qreal width = 0;
        qreal height = 0;

        QImage image;
        QString name = imageFormat.name();
        if (name.startsWith(":/"_L1)) // auto-detect resources
            name.prepend("qrc"_L1);
        QUrl url = QUrl(name);
        const QVariant variant = m_document->resource(QTextDocument::ImageResource, url);
        if (variant.userType() == QMetaType::QPixmap || variant.userType() == QMetaType::QImage) {
            image = qvariant_cast<QImage>(variant);
        } else if (variant.userType() == QMetaType::QByteArray) {
            data = variant.toByteArray();

            QBuffer buffer(&data);
            buffer.open(QIODevice::ReadOnly);
            probeImageData(&buffer, &image, &mimeType, &width, &height);
        } else {
            // try direct loading
            QFile file(imageFormat.name());
            if (file.open(QIODevice::ReadOnly) && !probeImageData(&file, &image, &mimeType, &width, &height)) {
                file.seek(0);
                data = file.readAll();
            }
        }

        if (! image.isNull()) {
            QBuffer imageBytes;

            int imgQuality = imageFormat.quality();
            if (imgQuality >= 100 || imgQuality <= 0 || image.hasAlphaChannel()) {
                QImageWriter imageWriter(&imageBytes, "png");
                imageWriter.write(image);

                data = imageBytes.data();
                mimeType = QStringLiteral("image/png");
            } else {
                // Write images without alpha channel as jpg with quality set by QTextImageFormat
                QImageWriter imageWriter(&imageBytes, "jpg");
                imageWriter.setQuality(imgQuality);
                imageWriter.write(image);

                data = imageBytes.data();
                mimeType = QStringLiteral("image/jpg");
            }

            width = image.width();
            height = image.height();
        }

        if (!data.isEmpty()) {
            if (imageFormat.hasProperty(QTextFormat::ImageWidth)) {
                width = imageFormat.width();
            }
            if (imageFormat.hasProperty(QTextFormat::ImageHeight)) {
                height = imageFormat.height();
            }

            QString filename = m_strategy->createUniqueImageName();

            m_strategy->addFile(filename, mimeType, data);

            writer.writeAttribute(svgNS, QString::fromLatin1("width"), pixelToPoint(width));
            writer.writeAttribute(svgNS, QString::fromLatin1("height"), pixelToPoint(height));
            writer.writeAttribute(textNS, QStringLiteral("anchor-type"), QStringLiteral("as-char"));
            writer.writeStartElement(drawNS, QString::fromLatin1("image"));
            writer.writeAttribute(xlinkNS, QString::fromLatin1("href"), filename);
            writer.writeEndElement(); // image
        }
    }
    writer.writeEndElement(); // frame
}